

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O1

void __thiscall EPoller::EPoller(EPoller *this)

{
  int iVar1;
  value_type *__val;
  pointer peVar2;
  long lVar3;
  Logger local_ff8;
  
  iVar1 = epoll_create1(0x80000);
  this->epollfd_ = iVar1;
  (this->events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peVar2 = (pointer)operator_new(0xc000);
  (this->events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_start = peVar2;
  (this->events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_finish = peVar2;
  (this->events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = peVar2 + 0x1000;
  *(undefined8 *)peVar2 = 0;
  *(undefined4 *)((long)&peVar2->data + 4) = 0;
  lVar3 = 0xc;
  do {
    *(undefined4 *)((long)&peVar2->data + lVar3 + 4) = *(undefined4 *)((long)&peVar2->data + 4);
    *(undefined8 *)((long)&peVar2->events + lVar3) = *(undefined8 *)peVar2;
    lVar3 = lVar3 + 0xc;
  } while (lVar3 != 0xc000);
  (this->events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_finish = peVar2 + 0x1000;
  (this->channels_)._M_h._M_buckets = &(this->channels_)._M_h._M_single_bucket;
  (this->channels_)._M_h._M_bucket_count = 1;
  (this->channels_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->channels_)._M_h._M_element_count = 0;
  (this->channels_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->channels_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->channels_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (this->epollfd_ < 0) {
    Logger::Logger(&local_ff8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EPoller.cpp"
                   ,0xb);
    if (0xe < ((int)&local_ff8 + 0xfa8) - (int)local_ff8.impl_.stream_.buffer_.cur_) {
      builtin_strncpy(local_ff8.impl_.stream_.buffer_.cur_,"Error: Epoller",0xe);
      local_ff8.impl_.stream_.buffer_.cur_ = local_ff8.impl_.stream_.buffer_.cur_ + 0xe;
    }
    Logger::~Logger(&local_ff8);
  }
  return;
}

Assistant:

EPoller::EPoller() : epollfd_(epoll_create1(EPOLL_CLOEXEC)), events_(kEventInit) {
    if (epollfd_ < 0) {
        LOG << "Error: Epoller";
    }
}